

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O0

CURLcode ftp_state_pasv_resp(connectdata *conn,int ftpcode)

{
  curl_strdup_callback p_Var1;
  int iVar2;
  CURLcode CVar3;
  char *pcVar4;
  char *local_a0;
  char *host_name;
  uint port [2];
  uint ip [4];
  int i;
  uint uStack_5c;
  char sep1;
  char separator [4];
  uint num;
  char *ptr;
  char *str;
  unsigned_short connectport;
  Curl_dns_entry *pCStack_40;
  int rc;
  Curl_dns_entry *addr;
  Curl_easy *data;
  anon_union_240_10_26c073a1_for_proto *paStack_28;
  CURLcode result;
  ftp_conn *ftpc;
  connectdata *pcStack_18;
  int ftpcode_local;
  connectdata *conn_local;
  
  paStack_28 = &conn->proto;
  addr = (Curl_dns_entry *)conn->data;
  pCStack_40 = (Curl_dns_entry *)0x0;
  ptr = (((Curl_easy *)addr)->state).buffer + 4;
  ftpc._4_4_ = ftpcode;
  pcStack_18 = conn;
  (*Curl_cfree)((conn->proto).ftpc.newhost);
  (paStack_28->ftpc).newhost = (char *)0x0;
  if (((paStack_28->ftpc).count1 == 0) && (ftpc._4_4_ == 0xe5)) {
    _separator = strchr(ptr,0x28);
    if (_separator != (char *)0x0) {
      _separator = _separator + 1;
      iVar2 = __isoc99_sscanf(_separator,"%c%c%c%u%c",&i,(long)&i + 1,(long)&i + 2,
                              &stack0xffffffffffffffa4,(long)&i + 3);
      if (iVar2 == 5) {
        ip[3]._3_1_ = (char)i;
        for (ip[2] = 1; (int)ip[2] < 4; ip[2] = ip[2] + 1) {
          if (*(char *)((long)&i + (long)(int)ip[2]) != (char)i) {
            _separator = (char *)0x0;
            break;
          }
        }
        if (0xffff < uStack_5c) {
          Curl_failf((Curl_easy *)addr,"Illegal port number in EPSV reply");
          return CURLE_FTP_WEIRD_PASV_REPLY;
        }
        if (_separator != (char *)0x0) {
          (paStack_28->ftpc).newport = (unsigned_short)uStack_5c;
          p_Var1 = Curl_cstrdup;
          pcVar4 = control_address(pcStack_18);
          pcVar4 = (*p_Var1)(pcVar4);
          (paStack_28->ftpc).newhost = pcVar4;
          if ((paStack_28->ftpc).newhost == (char *)0x0) {
            return CURLE_OUT_OF_MEMORY;
          }
        }
      }
      else {
        _separator = (char *)0x0;
      }
    }
    if (_separator == (char *)0x0) {
      Curl_failf((Curl_easy *)addr,"Weirdly formatted EPSV reply");
      return CURLE_FTP_WEIRD_PASV_REPLY;
    }
  }
  else {
    if (((paStack_28->ftpc).count1 != 1) || (ftpc._4_4_ != 0xe3)) {
      if ((paStack_28->ftpc).count1 == 0) {
        CVar3 = ftp_epsv_disable(pcStack_18);
        return CVar3;
      }
      Curl_failf((Curl_easy *)addr,"Bad PASV/EPSV response: %03d",(ulong)ftpc._4_4_);
      return CURLE_FTP_WEIRD_PASV_REPLY;
    }
    while ((*ptr != '\0' &&
           (iVar2 = __isoc99_sscanf(ptr,"%u,%u,%u,%u,%u,%u",port,port + 1,ip,ip + 1,&host_name,
                                    (long)&host_name + 4), iVar2 != 6))) {
      ptr = ptr + 1;
    }
    if (((((*ptr == '\0') || (0xff < port[0])) || (0xff < port[1])) ||
        ((0xff < ip[0] || (0xff < ip[1])))) ||
       ((0xff < (uint)host_name || (0xff < host_name._4_4_)))) {
      Curl_failf((Curl_easy *)addr,"Couldn\'t interpret the 227-response");
      return CURLE_FTP_WEIRD_227_FORMAT;
    }
    if (((ulong)addr[0x83].addr & 1) == 0) {
      pcVar4 = curl_maprintf("%u.%u.%u.%u",(ulong)port[0],(ulong)port[1],(ulong)ip[0],(ulong)ip[1]);
      (paStack_28->ftpc).newhost = pcVar4;
    }
    else {
      Curl_infof((Curl_easy *)addr,"Skip %u.%u.%u.%u for data connection, re-use %s instead\n",
                 (ulong)port[0],(ulong)port[1],(ulong)ip[0],(ulong)ip[1],(pcStack_18->host).name);
      p_Var1 = Curl_cstrdup;
      pcVar4 = control_address(pcStack_18);
      pcVar4 = (*p_Var1)(pcVar4);
      (paStack_28->ftpc).newhost = pcVar4;
    }
    if ((paStack_28->ftpc).newhost == (char *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
    (paStack_28->ftpc).newport = (short)((uint)host_name << 8) + host_name._4_2_;
  }
  if (((pcStack_18->bits).proxy & 1U) == 0) {
    Curl_resolv(pcStack_18,(paStack_28->ftpc).newhost,(uint)(paStack_28->ftpc).newport,
                &stack0xffffffffffffffc0);
    str._2_2_ = (paStack_28->ftpc).newport;
    if (pCStack_40 == (Curl_dns_entry *)0x0) {
      Curl_failf((Curl_easy *)addr,"Can\'t resolve new host %s:%hu",(paStack_28->ftpc).newhost,
                 (ulong)str._2_2_);
      return CURLE_FTP_CANT_GET_HOST;
    }
  }
  else {
    if (((pcStack_18->bits).socksproxy & 1U) == 0) {
      local_a0 = (pcStack_18->http_proxy).host.name;
    }
    else {
      local_a0 = (pcStack_18->socks_proxy).host.name;
    }
    Curl_resolv(pcStack_18,local_a0,(int)pcStack_18->port,&stack0xffffffffffffffc0);
    str._2_2_ = (ushort)pcStack_18->port;
    if (pCStack_40 == (Curl_dns_entry *)0x0) {
      Curl_failf((Curl_easy *)addr,"Can\'t resolve proxy host %s:%hu",local_a0,
                 pcStack_18->port & 0xffff);
      return CURLE_COULDNT_RESOLVE_PROXY;
    }
  }
  (pcStack_18->bits).tcpconnect[1] = false;
  data._4_4_ = Curl_connecthost(pcStack_18,pCStack_40);
  if (data._4_4_ == CURLE_OK) {
    if (((ulong)addr[0x82].addr & 1) != 0) {
      ftp_pasv_verbose(pcStack_18,pCStack_40->addr,(paStack_28->ftpc).newhost,(uint)str._2_2_);
    }
    Curl_resolv_unlock((Curl_easy *)addr,pCStack_40);
    (*Curl_cfree)(pcStack_18->secondaryhostname);
    pcStack_18->secondaryhostname = (char *)0x0;
    pcStack_18->secondary_port = (paStack_28->ftpc).newport;
    pcVar4 = (*Curl_cstrdup)((paStack_28->ftpc).newhost);
    pcStack_18->secondaryhostname = pcVar4;
    if (pcStack_18->secondaryhostname == (char *)0x0) {
      conn_local._4_4_ = CURLE_OUT_OF_MEMORY;
    }
    else {
      (pcStack_18->bits).do_more = true;
      _state(pcStack_18,FTP_STOP);
      conn_local._4_4_ = data._4_4_;
    }
  }
  else {
    Curl_resolv_unlock((Curl_easy *)addr,pCStack_40);
    if (((paStack_28->ftpc).count1 == 0) && (ftpc._4_4_ == 0xe5)) {
      conn_local._4_4_ = ftp_epsv_disable(pcStack_18);
    }
    else {
      conn_local._4_4_ = data._4_4_;
    }
  }
  return conn_local._4_4_;
}

Assistant:

static CURLcode ftp_state_pasv_resp(struct connectdata *conn,
                                    int ftpcode)
{
  struct ftp_conn *ftpc = &conn->proto.ftpc;
  CURLcode result;
  struct Curl_easy *data = conn->data;
  struct Curl_dns_entry *addr = NULL;
  int rc;
  unsigned short connectport; /* the local port connect() should use! */
  char *str = &data->state.buffer[4];  /* start on the first letter */

  /* if we come here again, make sure the former name is cleared */
  Curl_safefree(ftpc->newhost);

  if((ftpc->count1 == 0) &&
     (ftpcode == 229)) {
    /* positive EPSV response */
    char *ptr = strchr(str, '(');
    if(ptr) {
      unsigned int num;
      char separator[4];
      ptr++;
      if(5 == sscanf(ptr, "%c%c%c%u%c",
                     &separator[0],
                     &separator[1],
                     &separator[2],
                     &num,
                     &separator[3])) {
        const char sep1 = separator[0];
        int i;

        /* The four separators should be identical, or else this is an oddly
           formatted reply and we bail out immediately. */
        for(i = 1; i<4; i++) {
          if(separator[i] != sep1) {
            ptr = NULL; /* set to NULL to signal error */
            break;
          }
        }
        if(num > 0xffff) {
          failf(data, "Illegal port number in EPSV reply");
          return CURLE_FTP_WEIRD_PASV_REPLY;
        }
        if(ptr) {
          ftpc->newport = (unsigned short)(num & 0xffff);
          ftpc->newhost = strdup(control_address(conn));
          if(!ftpc->newhost)
            return CURLE_OUT_OF_MEMORY;
        }
      }
      else
        ptr = NULL;
    }
    if(!ptr) {
      failf(data, "Weirdly formatted EPSV reply");
      return CURLE_FTP_WEIRD_PASV_REPLY;
    }
  }
  else if((ftpc->count1 == 1) &&
          (ftpcode == 227)) {
    /* positive PASV response */
    unsigned int ip[4];
    unsigned int port[2];

    /*
     * Scan for a sequence of six comma-separated numbers and use them as
     * IP+port indicators.
     *
     * Found reply-strings include:
     * "227 Entering Passive Mode (127,0,0,1,4,51)"
     * "227 Data transfer will passively listen to 127,0,0,1,4,51"
     * "227 Entering passive mode. 127,0,0,1,4,51"
     */
    while(*str) {
      if(6 == sscanf(str, "%u,%u,%u,%u,%u,%u",
                     &ip[0], &ip[1], &ip[2], &ip[3],
                     &port[0], &port[1]))
        break;
      str++;
    }

    if(!*str || (ip[0] > 255) || (ip[1] > 255)  || (ip[2] > 255)  ||
       (ip[3] > 255) || (port[0] > 255)  || (port[1] > 255) ) {
      failf(data, "Couldn't interpret the 227-response");
      return CURLE_FTP_WEIRD_227_FORMAT;
    }

    /* we got OK from server */
    if(data->set.ftp_skip_ip) {
      /* told to ignore the remotely given IP but instead use the host we used
         for the control connection */
      infof(data, "Skip %u.%u.%u.%u for data connection, re-use %s instead\n",
            ip[0], ip[1], ip[2], ip[3],
            conn->host.name);
      ftpc->newhost = strdup(control_address(conn));
    }
    else
      ftpc->newhost = aprintf("%u.%u.%u.%u", ip[0], ip[1], ip[2], ip[3]);

    if(!ftpc->newhost)
      return CURLE_OUT_OF_MEMORY;

    ftpc->newport = (unsigned short)(((port[0]<<8) + port[1]) & 0xffff);
  }
  else if(ftpc->count1 == 0) {
    /* EPSV failed, move on to PASV */
    return ftp_epsv_disable(conn);
  }
  else {
    failf(data, "Bad PASV/EPSV response: %03d", ftpcode);
    return CURLE_FTP_WEIRD_PASV_REPLY;
  }

  if(conn->bits.proxy) {
    /*
     * This connection uses a proxy and we need to connect to the proxy again
     * here. We don't want to rely on a former host lookup that might've
     * expired now, instead we remake the lookup here and now!
     */
    const char * const host_name = conn->bits.socksproxy ?
      conn->socks_proxy.host.name : conn->http_proxy.host.name;
    rc = Curl_resolv(conn, host_name, (int)conn->port, &addr);
    if(rc == CURLRESOLV_PENDING)
      /* BLOCKING, ignores the return code but 'addr' will be NULL in
         case of failure */
      (void)Curl_resolver_wait_resolv(conn, &addr);

    connectport =
      (unsigned short)conn->port; /* we connect to the proxy's port */

    if(!addr) {
      failf(data, "Can't resolve proxy host %s:%hu", host_name, connectport);
      return CURLE_COULDNT_RESOLVE_PROXY;
    }
  }
  else {
    /* normal, direct, ftp connection */
    rc = Curl_resolv(conn, ftpc->newhost, ftpc->newport, &addr);
    if(rc == CURLRESOLV_PENDING)
      /* BLOCKING */
      (void)Curl_resolver_wait_resolv(conn, &addr);

    connectport = ftpc->newport; /* we connect to the remote port */

    if(!addr) {
      failf(data, "Can't resolve new host %s:%hu", ftpc->newhost, connectport);
      return CURLE_FTP_CANT_GET_HOST;
    }
  }

  conn->bits.tcpconnect[SECONDARYSOCKET] = FALSE;
  result = Curl_connecthost(conn, addr);

  if(result) {
    Curl_resolv_unlock(data, addr); /* we're done using this address */
    if(ftpc->count1 == 0 && ftpcode == 229)
      return ftp_epsv_disable(conn);

    return result;
  }


  /*
   * When this is used from the multi interface, this might've returned with
   * the 'connected' set to FALSE and thus we are now awaiting a non-blocking
   * connect to connect.
   */

  if(data->set.verbose)
    /* this just dumps information about this second connection */
    ftp_pasv_verbose(conn, addr->addr, ftpc->newhost, connectport);

  Curl_resolv_unlock(data, addr); /* we're done using this address */

  Curl_safefree(conn->secondaryhostname);
  conn->secondary_port = ftpc->newport;
  conn->secondaryhostname = strdup(ftpc->newhost);
  if(!conn->secondaryhostname)
    return CURLE_OUT_OF_MEMORY;

  conn->bits.do_more = TRUE;
  state(conn, FTP_STOP); /* this phase is completed */

  return result;
}